

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O3

shared_ptr<SchemeObject> __thiscall ExecutionResult::force_value(ExecutionResult *this)

{
  default_delete<TailContext> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  TailContext *__ptr;
  element_type *peVar1;
  execution_result_t eVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  _Head_base<0UL,_TailContext_*,_false> _Var5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  execution_result_t *in_RSI;
  shared_ptr<SchemeObject> sVar6;
  undefined1 local_50 [24];
  _Head_base<0UL,_TailContext_*,_false> local_38;
  
  if (*in_RSI == TAIL_CALL) {
    this_00 = (default_delete<TailContext> *)(in_RSI + 6);
    do {
      SchemeProcedure::execute
                ((ExecutionResult *)local_50,(SchemeProcedure *)**(undefined8 **)(in_RSI + 6),
                 (list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                  *)(*(undefined8 **)(in_RSI + 6) + 2));
      uVar4 = local_50._16_8_;
      uVar3 = local_50._8_8_;
      *in_RSI = local_50._0_4_;
      local_50._8_8_ = (element_type *)0x0;
      local_50._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 4);
      *(undefined8 *)(in_RSI + 2) = uVar3;
      *(undefined8 *)(in_RSI + 4) = uVar4;
      in_RDX._M_pi = extraout_RDX;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        in_RDX._M_pi = extraout_RDX_00;
      }
      _Var5._M_head_impl = local_38._M_head_impl;
      local_38._M_head_impl = (TailContext *)0x0;
      __ptr = *(TailContext **)this_00;
      *(TailContext **)this_00 = _Var5._M_head_impl;
      if (__ptr != (TailContext *)0x0) {
        std::default_delete<TailContext>::operator()(this_00,__ptr);
        in_RDX._M_pi = extraout_RDX_01;
        if ((_Head_base<0UL,_TailContext_*,_false>)local_38._M_head_impl !=
            (_Head_base<0UL,_TailContext_*,_false>)0x0) {
          std::default_delete<TailContext>::operator()
                    ((default_delete<TailContext> *)&local_38,local_38._M_head_impl);
          in_RDX._M_pi = extraout_RDX_02;
        }
      }
      local_38._M_head_impl = (TailContext *)0x0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._16_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._16_8_);
        in_RDX._M_pi = extraout_RDX_03;
      }
    } while (*in_RSI == TAIL_CALL);
  }
  eVar2 = in_RSI[3];
  this->type = in_RSI[2];
  *(execution_result_t *)&this->field_0x4 = eVar2;
  peVar1 = *(element_type **)(in_RSI + 4);
  (this->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  if (peVar1 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&peVar1[1]._vptr_SchemeObject = *(int *)&peVar1[1]._vptr_SchemeObject + 1;
      UNLOCK();
    }
    else {
      *(int *)&peVar1[1]._vptr_SchemeObject = *(int *)&peVar1[1]._vptr_SchemeObject + 1;
    }
  }
  sVar6.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar6.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<SchemeObject>)
         sVar6.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SchemeObject> ExecutionResult::force_value()
{
    while(type == execution_result_t::TAIL_CALL)
    {
        (*this) = tail_context->func->execute(tail_context->args);
    }
    return value;
}